

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_long>::getBestBFromData
          (FastPForImpl<4U,_unsigned_long> *this,unsigned_long *in,uint8_t *bestb,
          uint8_t *bestcexcept,uint8_t *maxb)

{
  long lVar1;
  byte bVar2;
  uint32_t k;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int aiStack_128 [68];
  
  for (lVar4 = 0; lVar4 != 0x41; lVar4 = lVar4 + 1) {
    aiStack_128[lVar4] = 0;
  }
  for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
    uVar9 = in[lVar4];
    if (uVar9 == 0) {
      uVar9 = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar9 = (ulong)((int)lVar1 + 1);
    }
    aiStack_128[uVar9] = aiStack_128[uVar9] + 1;
  }
  bVar2 = 0x41;
  do {
    bVar2 = bVar2 - 1;
  } while (aiStack_128[bVar2] == 0);
  *bestb = bVar2;
  *maxb = bVar2;
  iVar3 = 0;
  bVar2 = *bestb;
  *bestcexcept = '\0';
  uVar8 = (uint)*bestb;
  uVar6 = (uint)bVar2 << 7;
  do {
    iVar13 = (*maxb - uVar8) + 8;
    iVar12 = (*maxb - uVar8) + 9;
    uVar10 = uVar8 << 7 | 8;
    do {
      uVar9 = (ulong)uVar8;
      uVar8 = uVar8 - 1;
      if (0x3f < uVar8) {
        return;
      }
      iVar3 = iVar3 + aiStack_128[uVar9];
      iVar5 = 0;
      if (iVar12 == 9) {
        iVar5 = iVar3;
      }
      iVar13 = iVar13 + 1;
      uVar11 = uVar10 - 0x80;
      iVar12 = iVar12 + 1;
      iVar5 = iVar13 * iVar3 - iVar5;
      uVar7 = iVar5 + -0x80 + uVar10;
      uVar10 = uVar11;
    } while (uVar6 <= uVar7);
    uVar6 = iVar5 + uVar11;
    *bestb = (uint8_t)uVar8;
    *bestcexcept = (uint8_t)iVar3;
  } while( true );
}

Assistant:

void getBestBFromData(const IntType *in, uint8_t &bestb, uint8_t &bestcexcept,
                        uint8_t &maxb) {
    uint8_t bits = sizeof(IntType) * 8;
    uint32_t freqs[65];
    for (uint32_t k = 0; k <= bits; ++k) freqs[k] = 0;
    for (uint32_t k = 0; k < BlockSize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    bestb = bits;
    while (freqs[bestb] == 0) bestb--;
    maxb = bestb;
    uint32_t bestcost = bestb * BlockSize;
    uint32_t cexcept = 0;
    bestcexcept = static_cast<uint8_t>(cexcept);
    for (uint32_t b = bestb - 1; b < bits; --b) {
      cexcept += freqs[b + 1];
      uint32_t thiscost = cexcept * overheadofeachexcept +
                          cexcept * (maxb - b) + b * BlockSize +
                          8;  // the  extra 8 is the cost of storing maxbits
      if (maxb - b == 1) thiscost -= cexcept;
      if (thiscost < bestcost) {
        bestcost = thiscost;
        bestb = static_cast<uint8_t>(b);
        bestcexcept = static_cast<uint8_t>(cexcept);
      }
    }
  }